

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

int pcut_get_test_timeout(pcut_item_t *test)

{
  int iVar1;
  int *piVar2;
  
  piVar2 = &test->extras->timeout;
  iVar1 = 3;
  do {
    if (((pcut_extra_t *)(piVar2 + -1))->type == 0) {
      iVar1 = *piVar2;
    }
    else if (((pcut_extra_t *)(piVar2 + -1))->type == 2) {
      return iVar1;
    }
    piVar2 = piVar2 + 2;
  } while( true );
}

Assistant:

int pcut_get_test_timeout(pcut_item_t *test) {
	int timeout = PCUT_DEFAULT_TEST_TIMEOUT;
	pcut_extra_t *extras = test->extras;


	while (extras->type != PCUT_EXTRA_LAST) {
		if (extras->type == PCUT_EXTRA_TIMEOUT) {
			timeout = extras->timeout;
		}
		extras++;
	}

	return timeout;
}